

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void ManagerTest<uttt::IBoard,uttt::RandomPlayout>(void)

{
  _Hash_node_base *p_Var1;
  pointer plVar2;
  iterator iVar3;
  IBot<uttt::IBoard> *pIVar4;
  IBoard *pIVar5;
  ostream *poVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  int iVar9;
  ulong *puVar10;
  __hash_code __code_1;
  IBot<uttt::IBoard> **ppIVar11;
  __hash_code __code;
  vector<long_long,_std::allocator<long_long>_> bot_ids;
  vector<game::IBot<uttt::IBoard>_*,_std::allocator<game::IBot<uttt::IBoard>_*>_> bots;
  IBoard game;
  Manager<uttt::IBoard> manager;
  longlong local_d0;
  vector<long_long,_std::allocator<long_long>_> local_c8;
  IBot<uttt::IBoard> **local_a8;
  iterator iStack_a0;
  IBot<uttt::IBoard> **local_98;
  IBoard local_88;
  Manager<uttt::IBoard> local_70;
  
  uttt::IBoard::IBoard(&local_88);
  ::manager::Manager<uttt::IBoard>::Manager(&local_70,&local_88);
  local_a8 = (IBot<uttt::IBoard> **)0x0;
  iStack_a0._M_current = (IBot<uttt::IBoard> **)0x0;
  local_98 = (IBot<uttt::IBoard> **)0x0;
  pIVar4 = (IBot<uttt::IBoard> *)operator_new(0x20);
  pIVar4->_vptr_IBot = (_func_int **)&PTR__IBot_00161830;
  pIVar5 = (IBoard *)operator_new(0x18);
  *(undefined8 *)((pIVar5->micro)._M_elems + 6) = local_88._16_8_;
  pIVar5->macro = local_88.macro;
  (pIVar5->micro)._M_elems[0] = local_88.micro._M_elems[0];
  (pIVar5->micro)._M_elems[1] = local_88.micro._M_elems[1];
  *(undefined8 *)((pIVar5->micro)._M_elems + 2) = local_88.micro._M_elems._4_8_;
  pIVar4->game = pIVar5;
  pIVar4->_vptr_IBot = (_func_int **)&PTR__IBot_001617d0;
  pIVar4[1]._vptr_IBot = (_func_int **)mcts::MCTS_parallel<uttt::IBoard,uttt::RandomPlayout>;
  pIVar4[1].game = (IBoard *)0x3e8;
  local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)pIVar4;
  if (iStack_a0._M_current == local_98) {
    std::vector<game::IBot<uttt::IBoard>*,std::allocator<game::IBot<uttt::IBoard>*>>::
    _M_realloc_insert<generic_bots::FixedMctsBot<uttt::IBoard,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(*)(uttt::IBoard_const&,long_long)>*>
              ((vector<game::IBot<uttt::IBoard>*,std::allocator<game::IBot<uttt::IBoard>*>> *)
               &local_a8,iStack_a0,
               (FixedMctsBot<uttt::IBoard,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_(*)(const_uttt::IBoard_&,_long_long)>
                **)&local_c8);
  }
  else {
    *iStack_a0._M_current = pIVar4;
    iStack_a0._M_current = iStack_a0._M_current + 1;
  }
  pIVar4 = (IBot<uttt::IBoard> *)operator_new(0x18);
  pIVar4->_vptr_IBot = (_func_int **)&PTR__IBot_00161830;
  pIVar5 = (IBoard *)operator_new(0x18);
  *(undefined8 *)((pIVar5->micro)._M_elems + 6) = local_88._16_8_;
  pIVar5->macro = local_88.macro;
  (pIVar5->micro)._M_elems[0] = local_88.micro._M_elems[0];
  (pIVar5->micro)._M_elems[1] = local_88.micro._M_elems[1];
  *(undefined8 *)((pIVar5->micro)._M_elems + 2) = local_88.micro._M_elems._4_8_;
  pIVar4->game = pIVar5;
  pIVar4->_vptr_IBot = (_func_int **)&PTR__IBot_00161868;
  *(undefined4 *)&pIVar4[1]._vptr_IBot = 9;
  if (iStack_a0._M_current == local_98) {
    local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pIVar4;
    std::vector<game::IBot<uttt::IBoard>*,std::allocator<game::IBot<uttt::IBoard>*>>::
    _M_realloc_insert<generic_bots::MinimaxBot<uttt::IBoard,minimax::ABeta<uttt::IBoard,minimax::Eval<uttt::IBoard>>>*>
              ((vector<game::IBot<uttt::IBoard>*,std::allocator<game::IBot<uttt::IBoard>*>> *)
               &local_a8,iStack_a0,
               (MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_minimax::Eval<uttt::IBoard>_>_>
                **)&local_c8);
  }
  else {
    *iStack_a0._M_current = pIVar4;
    iStack_a0._M_current = iStack_a0._M_current + 1;
  }
  iVar3._M_current = iStack_a0._M_current;
  local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (longlong *)0x0;
  if (local_a8 != iStack_a0._M_current) {
    ppIVar11 = local_a8;
    do {
      pIVar4 = *ppIVar11;
      local_d0 = ::manager::Manager<uttt::IBoard>::AddBot(&local_70,pIVar4);
      if (local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                  (&local_c8,
                   (iterator)
                   local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_d0);
      }
      else {
        *local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_d0;
        local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (pIVar4 != (IBot<uttt::IBoard> *)0x0) {
        (*pIVar4->_vptr_IBot[1])(pIVar4);
      }
      ppIVar11 = ppIVar11 + 1;
    } while (ppIVar11 != iVar3._M_current);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Initial ratings:",0x10);
  plVar2 = local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar10 = (ulong *)local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
    do {
      p_Var1 = (_Hash_node_base *)*puVar10;
      local_d0 = CONCAT71(local_d0._1_7_,0x20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_d0,1);
      p_Var7 = local_70.bots._M_h._M_buckets[(ulong)p_Var1 % local_70.bots._M_h._M_bucket_count];
      for (p_Var8 = local_70.bots._M_h._M_buckets
                    [(ulong)p_Var1 % local_70.bots._M_h._M_bucket_count]->_M_nxt;
          p_Var8[1]._M_nxt != p_Var1; p_Var8 = p_Var8->_M_nxt) {
        p_Var7 = p_Var8;
      }
      std::ostream::_M_insert<double>((double)p_Var7->_M_nxt[2]._M_nxt[2]._M_nxt);
      puVar10 = puVar10 + 1;
    } while (puVar10 != (ulong *)plVar2);
  }
  local_d0 = CONCAT71(local_d0._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_d0,1);
  iVar9 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Round ",6);
    iVar9 = iVar9 + 1;
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,200);
    local_d0 = CONCAT71(local_d0._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_d0,1);
    ::manager::Manager<uttt::IBoard>::RoundRobin(&local_70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"New ratings:",0xc);
    plVar2 = local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar10 = (ulong *)local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>.
                            _M_impl.super__Vector_impl_data._M_start; puVar10 != (ulong *)plVar2;
        puVar10 = puVar10 + 1) {
      p_Var1 = (_Hash_node_base *)*puVar10;
      local_d0 = CONCAT71(local_d0._1_7_,0x20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_d0,1);
      p_Var7 = local_70.bots._M_h._M_buckets[(ulong)p_Var1 % local_70.bots._M_h._M_bucket_count];
      for (p_Var8 = local_70.bots._M_h._M_buckets
                    [(ulong)p_Var1 % local_70.bots._M_h._M_bucket_count]->_M_nxt;
          p_Var8[1]._M_nxt != p_Var1; p_Var8 = p_Var8->_M_nxt) {
        p_Var7 = p_Var8;
      }
      std::ostream::_M_insert<double>((double)p_Var7->_M_nxt[2]._M_nxt[2]._M_nxt);
    }
    local_d0 = CONCAT71(local_d0._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_d0,1);
  } while (iVar9 != 200);
  if ((ulong *)local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
               super__Vector_impl_data._M_start != (ulong *)0x0) {
    operator_delete(local_c8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a8 != (IBot<uttt::IBoard> **)0x0) {
    operator_delete(local_a8);
  }
  ::manager::Manager<uttt::IBoard>::~Manager(&local_70);
  return;
}

Assistant:

void
ManagerTest()
{
    IGame game;
    manager::Manager<IGame> manager(&game);

    std::vector<game::IBot<IGame> *> bots;
    bots.emplace_back(new generic_bots::FixedMctsBot<IGame, std::vector<mcts::MCTSResults> (*)(const IGame &, long long)>(&game, mcts::MCTS_parallel<IGame, RandomPlayout>, 1000));
    bots.emplace_back(new generic_bots::MinimaxBot<IGame, minimax::ABeta<IGame>>(&game, 9));

    std::vector<long long> bot_ids;
    for (auto bot : bots)
    {
        bot_ids.emplace_back(manager.AddBot(bot));
        delete bot;
    }

    std::cout << "Initial ratings:";
    for (long long id : bot_ids)
        std::cout << ' ' << manager.GetBotRating(id);
    std::cout << '\n';

    int num_rounds = 200;
    for (int i = 0; i < num_rounds; ++i)
    {
        std::cout << "Round " << i + 1 << " / " << num_rounds << '\n';
        manager.RoundRobin();
        std::cout << "New ratings:";
        for (long long id : bot_ids)
            std::cout << ' ' << manager.GetBotRating(id);
        std::cout << '\n';
    }
}